

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void check_input<unsigned_int>(uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0)

{
  int iVar1;
  uint32_t uVar2;
  lcp_t lVar3;
  ulong local_50;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t n0_local;
  uint *cache_input0_local;
  lcp_t *lcp_input0_local;
  uchar **from0_local;
  
  for (i_1 = 1; i_1 < n0; i_1 = i_1 + 1) {
    cmp(from0[i_1 - 1],from0[i_1]);
  }
  for (i_2 = 1; i_2 < n0; i_2 = i_2 + 1) {
    lcp(from0[i_2 - 1],from0[i_2]);
  }
  i_3 = 1;
  while( true ) {
    if (n0 <= i_3) {
      i_4 = 1;
      while( true ) {
        if (n0 <= i_4) {
          uVar2 = get_char<unsigned_int>(*from0,0);
          if (uVar2 != *cache_input0) {
            __assert_fail("get_char<CharT>(*from0,0)==cache_input0[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x431,
                          "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                         );
          }
          local_50 = 1;
          while( true ) {
            if (n0 <= local_50) {
              return;
            }
            uVar2 = get_char<unsigned_int>(from0[local_50],lcp_input0[local_50 - 1]);
            if (uVar2 != cache_input0[local_50]) break;
            local_50 = local_50 + 1;
          }
          __assert_fail("get_char<CharT>(from0[i],lcp_input0[i-1]) ==cache_input0[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x433,
                        "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                       );
        }
        lVar3 = lcp(from0[i_4 - 1],from0[i_4]);
        if (lVar3 != lcp_input0[i_4 - 1]) break;
        i_4 = i_4 + 1;
      }
      __assert_fail("lcp(from0[i-1],from0[i])==lcp_input0[i-1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x430,
                    "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                   );
    }
    iVar1 = cmp(from0[i_3 - 1],from0[i_3]);
    if (0 < iVar1) break;
    i_3 = i_3 + 1;
  }
  __assert_fail("cmp(from0[i-1],from0[i])<=0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x42f,
                "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
               );
}

Assistant:

static void
check_input(unsigned char** from0, lcp_t* lcp_input0, CharT* cache_input0, size_t n0)
{
	(void) from0;
	(void) lcp_input0;
	(void) cache_input0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)if(lcp(from0[i-1],from0[i])!=lcp_input0[i-1]){
		debug()<<"Oops: "<<"lcp('"<<from0[i-1]<<"', '"<<from0[i]<<"')="
			<<lcp(from0[i-1],from0[i])<<" != "<<lcp_input0[i-1]<<"\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
	for(size_t i=1;i<n0;++i)assert(lcp(from0[i-1],from0[i])==lcp_input0[i-1]);
	assert(get_char<CharT>(*from0,0)==cache_input0[0]);
	for(size_t i=1;i<n0;++i)assert(get_char<CharT>(from0[i],lcp_input0[i-1])
			==cache_input0[i]);
#endif
}